

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O0

void xLearn::MAEMetric::mae_accum_thread
               (vector<float,_std::allocator<float>_> *Y,vector<float,_std::allocator<float>_> *pred
               ,real_t *error,size_t start_idx,size_t end_idx)

{
  ostream *poVar1;
  ostream *poVar2;
  const_reference pvVar3;
  ulong in_RCX;
  float *in_RDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  vector<float,_std::allocator<float>_> *pvVar4;
  ulong in_R8;
  float fVar5;
  size_t i;
  string *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff74;
  string *in_stack_ffffffffffffff78;
  LogSeverity in_stack_ffffffffffffff84;
  allocator local_51;
  string local_50 [36];
  Logger local_2c;
  ulong local_28;
  ulong local_20;
  float *local_18;
  vector<float,_std::allocator<float>_> *local_10;
  vector<float,_std::allocator<float>_> *local_8;
  
  local_28 = in_R8;
  if (in_R8 < in_RCX) {
    local_20 = in_RCX;
    Logger::Logger(&local_2c,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric.h"
               ,&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff78,"mae_accum_thread",
               (allocator *)&stack0xffffffffffffff77);
    poVar1 = Logger::Start(in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                           in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
    poVar1 = std::operator<<(poVar1,"CHECK_GE failed ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric.h"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x26b);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"end_idx");
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_28);
    poVar1 = std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar1,"start_idx");
    poVar2 = std::operator<<(poVar1," = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    Logger::~Logger((Logger *)poVar1);
    abort();
  }
  *in_RDX = 0.0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (; in_RCX < local_28; in_RCX = in_RCX + 1) {
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](local_8,in_RCX);
    fVar5 = *pvVar3;
    pvVar4 = local_10;
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](local_10,in_RCX);
    fVar5 = fVar5 - *pvVar3;
    abs((int)pvVar4);
    *local_18 = fVar5 + *local_18;
  }
  return;
}

Assistant:

static void mae_accum_thread(const std::vector<real_t>* Y,
                               const std::vector<real_t>* pred,
                               real_t* error,
                               size_t start_idx,
                               size_t end_idx) {
    CHECK_GE(end_idx, start_idx);
    *error = 0;
    for (size_t i = start_idx; i < end_idx; ++i) {
      (*error) += abs((*Y)[i] - (*pred)[i]);
    }
  }